

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_schematron(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing schematron : 1 of 10 functions ...\n");
  }
  iVar1 = test_xmlSchematronNewDocParserCtxt();
  iVar2 = test_xmlSchematronNewMemParserCtxt();
  iVar3 = test_xmlSchematronNewParserCtxt();
  iVar4 = test_xmlSchematronNewValidCtxt();
  iVar5 = test_xmlSchematronParse();
  iVar6 = test_xmlSchematronSetValidStructuredErrors();
  iVar7 = test_xmlSchematronValidateDoc();
  uVar8 = iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
  if (uVar8 != 0) {
    printf("Module schematron: %d errors\n",(ulong)uVar8);
  }
  return uVar8;
}

Assistant:

static int
test_schematron(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing schematron : 1 of 10 functions ...\n");
    test_ret += test_xmlSchematronNewDocParserCtxt();
    test_ret += test_xmlSchematronNewMemParserCtxt();
    test_ret += test_xmlSchematronNewParserCtxt();
    test_ret += test_xmlSchematronNewValidCtxt();
    test_ret += test_xmlSchematronParse();
    test_ret += test_xmlSchematronSetValidStructuredErrors();
    test_ret += test_xmlSchematronValidateDoc();

    if (test_ret != 0)
	printf("Module schematron: %d errors\n", test_ret);
    return(test_ret);
}